

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

void __thiscall deci::ast_for_t::~ast_for_t(ast_for_t *this)

{
  ast_t *this_00;
  pointer pcVar1;
  
  if (this->start != (ast_item_t *)0x0) {
    (*this->start->_vptr_ast_item_t[4])();
  }
  if (this->finish != (ast_item_t *)0x0) {
    (*this->finish->_vptr_ast_item_t[4])();
  }
  this_00 = this->loop;
  if (this_00 != (ast_t *)0x0) {
    ast_t::~ast_t(this_00);
  }
  operator_delete(this_00);
  if (this->step != (ast_item_t *)0x0) {
    (*this->step->_vptr_ast_item_t[4])();
  }
  pcVar1 = (this->identifier)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->identifier).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_ast_loop_t).super_ast_item_t._vptr_ast_item_t =
       (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3c8;
  return;
}

Assistant:

ast_for_t::~ast_for_t() {
    delete this->start;
    delete this->finish;
    delete this->loop;
    delete this->step;
  }